

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::Clear(ImFont *this)

{
  int *piVar1;
  Glyph *pGVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  ImGuiContext *pIVar5;
  
  this->FontSize = 0.0;
  (this->DisplayOffset).x = 0.0;
  (this->DisplayOffset).y = 1.0;
  *(undefined8 *)&this->ConfigDataCount = 0;
  *(undefined8 *)((long)&this->ConfigData + 6) = 0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  pGVar2 = (this->Glyphs).Data;
  if (pGVar2 != (Glyph *)0x0) {
    (this->Glyphs).Size = 0;
    pIVar5 = GImGui;
    (this->Glyphs).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar5->IO).MemFreeFn)(pGVar2);
    (this->Glyphs).Data = (Glyph *)0x0;
  }
  this->FallbackGlyph = (Glyph *)0x0;
  this->FallbackXAdvance = 0.0;
  pfVar3 = (this->IndexXAdvance).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexXAdvance).Size = 0;
    pIVar5 = GImGui;
    (this->IndexXAdvance).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar5->IO).MemFreeFn)(pfVar3);
    (this->IndexXAdvance).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    pIVar5 = GImGui;
    (this->IndexLookup).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar5->IO).MemFreeFn)(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  return;
}

Assistant:

void    ImFont::Clear()
{
    FontSize = 0.0f;
    DisplayOffset = ImVec2(0.0f, 1.0f);
    ConfigData = NULL;
    ConfigDataCount = 0;
    Ascent = Descent = 0.0f;
    ContainerAtlas = NULL;
    Glyphs.clear();
    FallbackGlyph = NULL;
    FallbackXAdvance = 0.0f;
    IndexXAdvance.clear();
    IndexLookup.clear();
}